

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

Type wabt::GetMemoryType(Type operand_type,Opcode opc)

{
  bool bVar1;
  Address AVar2;
  Enum EVar3;
  string_view x;
  string_view y;
  Opcode opc_local;
  string_view name;
  
  if (0xfffffffd < (uint)operand_type.enum_) {
    opc_local = opc;
    name.data_ = Opcode::GetName(&opc_local);
    name.size_ = strlen(name.data_);
    x = string_view::substr(&name,name.size_ - 2,0xffffffffffffffff);
    y.size_ = 2;
    y.data_ = "_u";
    bVar1 = operator==(x,y);
    AVar2 = Opcode::GetMemorySize(&opc_local);
    if (AVar2 == 4) {
      operand_type.enum_ = (uint)bVar1 + I32 | I32U;
    }
    else {
      if (AVar2 == 2) {
        EVar3 = I16U;
        operand_type.enum_ = I16;
      }
      else {
        if (AVar2 != 1) {
          return (Type)operand_type.enum_;
        }
        EVar3 = I8U;
        operand_type.enum_ = I8;
      }
      if (bVar1) {
        operand_type.enum_ = EVar3;
      }
    }
  }
  return (Type)operand_type.enum_;
}

Assistant:

inline Type GetMemoryType(Type operand_type, Opcode opc) {
  // TODO: something something SIMD.
  // TODO: this loses information of the type it is read into.
  // That may well not be the biggest deal since that is usually obvious
  // from context, if not, we should probably represent that as a cast around
  // the access, since it should not be part of the field type.
  if (operand_type == Type::I32 || operand_type == Type::I64) {
    auto name = string_view(opc.GetName());
    // FIXME: change into a new column in opcode.def instead?
    auto is_unsigned = name.substr(name.size() - 2) == "_u";
    switch (opc.GetMemorySize()) {
      case 1: return is_unsigned ? Type::I8U : Type::I8;
      case 2: return is_unsigned ? Type::I16U : Type::I16;
      case 4: return is_unsigned ? Type::I32U : Type::I32;
    }
  }
  return operand_type;
}